

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

int mbedtls_mpi_core_write_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *output,size_t output_length)

{
  ulong uVar1;
  ulong in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t i_1;
  size_t i;
  uchar *p;
  size_t bytes_to_copy;
  size_t stored_bytes;
  ulong local_50;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  uVar1 = in_RSI * 8;
  local_48 = in_RCX;
  if (uVar1 < in_RCX) {
    local_40 = (void *)((long)in_RDX + in_RSI * -8 + in_RCX);
    memset(in_RDX,0,in_RCX + in_RSI * -8);
    local_38 = uVar1;
  }
  else {
    for (; local_40 = in_RDX, local_38 = in_RCX, local_48 < uVar1; local_48 = local_48 + 1) {
      if ((*(ulong *)(in_RDI + (local_48 & 0xfffffffffffffff8)) >> (sbyte)((local_48 & 7) << 3) &
          0xff) != 0) {
        return -8;
      }
    }
  }
  for (local_50 = 0; local_50 < local_38; local_50 = local_50 + 1) {
    *(char *)((long)local_40 + (local_38 - local_50) + -1) =
         (char)(*(ulong *)(in_RDI + (local_50 & 0xfffffffffffffff8)) >> (sbyte)((local_50 & 7) << 3)
               );
  }
  return 0;
}

Assistant:

int mbedtls_mpi_core_write_be(const mbedtls_mpi_uint *X,
                              size_t X_limbs,
                              unsigned char *output,
                              size_t output_length)
{
    size_t stored_bytes;
    size_t bytes_to_copy;
    unsigned char *p;

    stored_bytes = X_limbs * ciL;

    if (stored_bytes < output_length) {
        /* There is enough space in the output buffer. Write initial
         * null bytes and record the position at which to start
         * writing the significant bytes. In this case, the execution
         * trace of this function does not depend on the value of the
         * number. */
        bytes_to_copy = stored_bytes;
        p = output + output_length - stored_bytes;
        memset(output, 0, output_length - stored_bytes);
    } else {
        /* The output buffer is smaller than the allocated size of X.
         * However X may fit if its leading bytes are zero. */
        bytes_to_copy = output_length;
        p = output;
        for (size_t i = bytes_to_copy; i < stored_bytes; i++) {
            if (GET_BYTE(X, i) != 0) {
                return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
            }
        }
    }

    for (size_t i = 0; i < bytes_to_copy; i++) {
        p[bytes_to_copy - i - 1] = GET_BYTE(X, i);
    }

    return 0;
}